

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O1

xmlRelaxNGParserCtxtPtr xmlRelaxNGNewParserCtxt(char *URL)

{
  xmlRelaxNGParserCtxtPtr __s;
  xmlChar *pxVar1;
  xmlGenericErrorFunc *pp_Var2;
  void **ppvVar3;
  
  if (URL == (char *)0x0) {
    __s = (xmlRelaxNGParserCtxtPtr)0x0;
  }
  else {
    __s = (xmlRelaxNGParserCtxtPtr)(*xmlMalloc)(0x100);
    if (__s == (xmlRelaxNGParserCtxtPtr)0x0) {
      __s = (xmlRelaxNGParserCtxtPtr)0x0;
      xmlRngPErrMemory((xmlRelaxNGParserCtxtPtr)0x0,"building parser\n");
    }
    else {
      memset(__s,0,0x100);
      pxVar1 = xmlStrdup((xmlChar *)URL);
      __s->URL = pxVar1;
      pp_Var2 = __xmlGenericError();
      __s->error = *pp_Var2;
      ppvVar3 = __xmlGenericErrorContext();
      __s->userData = *ppvVar3;
    }
  }
  return __s;
}

Assistant:

xmlRelaxNGParserCtxtPtr
xmlRelaxNGNewParserCtxt(const char *URL)
{
    xmlRelaxNGParserCtxtPtr ret;

    if (URL == NULL)
        return (NULL);

    ret =
        (xmlRelaxNGParserCtxtPtr) xmlMalloc(sizeof(xmlRelaxNGParserCtxt));
    if (ret == NULL) {
        xmlRngPErrMemory(NULL, "building parser\n");
        return (NULL);
    }
    memset(ret, 0, sizeof(xmlRelaxNGParserCtxt));
    ret->URL = xmlStrdup((const xmlChar *) URL);
    ret->error = xmlGenericError;
    ret->userData = xmlGenericErrorContext;
    return (ret);
}